

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

_Bool vec3_line_segments_on_same_line(vec3 ap0,vec3 ap1,vec3 bp0,vec3 bp1,float eps)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar3 = ap0.z;
  fVar1 = ap0.x;
  fVar2 = ap0.y;
  fVar6 = fVar1 - ap1.x;
  fVar7 = fVar2 - ap1.y;
  fVar8 = fVar3 - ap1.z;
  fVar9 = fVar1 - bp0.x;
  fVar10 = fVar2 - bp0.y;
  fVar4 = fVar3 - bp0.z;
  fVar11 = fVar7 * fVar4 - fVar8 * fVar10;
  fVar5 = fVar8 * fVar9 - fVar4 * fVar6;
  fVar4 = fVar10 * fVar6 - fVar9 * fVar7;
  if (fVar4 * fVar4 + fVar11 * fVar11 + fVar5 * fVar5 < eps * eps) {
    fVar1 = fVar1 - bp1.x;
    fVar2 = fVar2 - bp1.y;
    fVar4 = fVar6 * fVar2 + -fVar7 * fVar1;
    fVar3 = fVar3 - bp1.z;
    fVar1 = fVar1 * fVar8 + -fVar6 * fVar3;
    fVar2 = fVar3 * fVar7 - fVar2 * fVar8;
    return fVar4 * fVar4 + fVar2 * fVar2 + fVar1 * fVar1 < eps * eps;
  }
  return false;
}

Assistant:

bool vec3_line_segments_on_same_line(vec3 ap0, vec3 ap1, vec3 bp0, vec3 bp1, float eps) {
    // Check if triangle ap0, ap1, bp0 and ap0, ap1, bp1 both have area of 0
    vec3 v0 = vec3_cross(vec3_sub(ap0, ap1), vec3_sub(ap0, bp0));
    vec3 v1 = vec3_cross(vec3_sub(ap0, ap1), vec3_sub(ap0, bp1));
    return vec3_length_squared(v0) < eps*eps && vec3_length_squared(v1) < eps*eps;
}